

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebox.c
# Opt level: O0

int output_cvs(char *fname,int length)

{
  FILE *__stream;
  uint local_2c;
  int i;
  FILE *fp;
  int length_local;
  char *fname_local;
  
  __stream = fopen(fname,"w");
  if (__stream == (FILE *)0x0) {
    fname_local._4_4_ = 0;
  }
  else {
    for (local_2c = 0; (int)local_2c < length; local_2c = local_2c + 1) {
      fprintf(__stream,"%d %d %d\n",(ulong)local_2c,(ulong)(uint)(int)stream1[(int)local_2c],
              (ulong)(uint)(int)stream2[(int)local_2c]);
    }
    fclose(__stream);
    fname_local._4_4_ = 1;
  }
  return fname_local._4_4_;
}

Assistant:

int output_cvs(char *fname, int length)
{
   FILE *fp;
 
   int  i;

   fp = fopen(fname, "w");
   if(fp == NULL) 
      return 0;
   for (i = 0; i < length; i++)
   {
      fprintf(fp, "%d %d %d\n", i, stream1[i], stream2[i]);
   }
   fclose(fp);
   
   return 1;
}